

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O1

unordered_map<string,_char2double> * __thiscall
ProbMap::createTransitionDict
          (unordered_map<string,_char2double> *__return_storage_ptr__,ProbMap *this,
          string2int32 *freq_dict)

{
  int iVar1;
  pointer pcVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong *puVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this_00;
  ulong uVar10;
  type this_01;
  NodePtr pDVar11;
  long lVar12;
  Node *__ptr;
  key_type *key;
  size_type *psVar13;
  uint8_t *puVar14;
  ulong *puVar15;
  double dVar16;
  iterator iVar17;
  undefined1 local_168 [40];
  double local_140;
  undefined8 local_138;
  double local_130;
  NodePtr local_128;
  string2int32 *local_120;
  undefined1 local_118 [40];
  size_t local_f0;
  undefined8 local_e8;
  ProbMap *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  pair<char,_double> local_58;
  pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
  local_48;
  
  local_e0 = this;
  calcFirstBase(__return_storage_ptr__,this,freq_dict);
  iVar17 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(freq_dict);
  pDVar11 = (NodePtr)freq_dict->mInfo;
  if (iVar17.mKeyVals != pDVar11) {
    local_128 = pDVar11;
    local_120 = freq_dict;
    do {
      puVar14 = iVar17.mInfo;
      key = (key_type *)iVar17.mKeyVals;
      if ((int)key->_M_string_length < local_e0->codewordLen) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar2,pcVar2 + key->_M_string_length);
        iVar6 = checkFd(&local_d8,'A',freq_dict);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + key->_M_string_length);
        iVar7 = checkFd(&local_78,'T',freq_dict);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + key->_M_string_length);
        iVar8 = checkFd(&local_98,'G',freq_dict);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar2,pcVar2 + key->_M_string_length);
        iVar9 = checkFd(&local_b8,'C',freq_dict);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_e0->normalized == true) {
          iVar1 = *(int *)&key[1]._M_dataplus._M_p;
          if (iVar1 != 0) {
            dVar16 = 1.0 / (double)iVar1;
            local_168[0] = 0x41;
            local_168._8_8_ = (Node *)((double)iVar6 * dVar16);
            local_168[0x10] = 0x54;
            local_168._24_8_ = (double)iVar7 * dVar16;
            local_168[0x20] = 0x43;
            local_140 = (double)iVar9 * dVar16;
            local_138._0_1_ = 0x47;
            local_130 = (double)iVar8 * dVar16;
            local_118._0_8_ = 0xc4ceb9fe1a85ec53;
            local_118._8_8_ = local_118 + 0x20;
            local_118._24_8_ = 0;
            local_118._32_8_ = 0;
            local_f0 = 0;
            local_e8._0_4_ = 0x20;
            local_e8._4_4_ = 0;
            lVar12 = 0;
            local_118._16_8_ = local_118._8_8_;
            do {
              local_58._0_8_ = *(undefined8 *)(local_168 + lVar12);
              local_58.second = *(double *)(local_168 + lVar12 + 8);
              robin_hood::detail::
              Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
              emplace<robin_hood::pair<char,double>>
                        (&local_48,
                         (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>
                          *)local_118,&local_58);
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0x40);
            this_00 = robin_hood::detail::
                      Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      ::
                      operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                                ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                  *)__return_storage_ptr__,key);
            goto LAB_0012877d;
          }
          local_168._0_8_ = 0xc4ceb9fe1a85ec53;
          local_168._8_8_ = local_168 + 0x20;
          local_168._24_8_ = 0.0;
          local_168._32_8_ = 0;
          local_140 = 0.0;
          local_138._0_4_ = 0x20;
          local_138._4_4_ = 0;
          lVar12 = 0;
          local_168._16_8_ = local_168._8_8_;
          do {
            local_48.first.mKeyVals = *(NodePtr *)(&DAT_0015f180 + lVar12);
            local_48.first.mInfo = *(uint8_t **)(&UNK_0015f188 + lVar12);
            robin_hood::detail::
            Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
            emplace<robin_hood::pair<char,double>>
                      ((pair<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Iter<false>,_bool>
                        *)local_118,
                       (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>
                        *)local_168,(pair<char,_double> *)&local_48);
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x40);
          this_01 = robin_hood::detail::
                    Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                    ::
                    operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                              ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                *)__return_storage_ptr__,key);
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          operator=(this_01,(Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                             *)local_168);
          pDVar11 = local_128;
          freq_dict = local_120;
          if (local_168._32_8_ == 0) goto LAB_001287c8;
          local_168._24_8_ = 0.0;
          puVar4 = local_168;
          __ptr = (Node *)local_168._8_8_;
        }
        else {
          local_168[0] = 0x41;
          local_168._8_8_ = (Node *)(double)iVar6;
          local_168[0x10] = 0x54;
          local_168._24_8_ = (double)iVar7;
          local_168[0x20] = 0x43;
          local_140 = (double)iVar9;
          local_138._0_1_ = 0x47;
          local_130 = (double)iVar8;
          local_118._0_8_ = 0xc4ceb9fe1a85ec53;
          local_118._8_8_ = local_118 + 0x20;
          local_118._24_8_ = 0;
          local_118._32_8_ = 0;
          local_f0 = 0;
          local_e8._0_4_ = 0x20;
          local_e8._4_4_ = 0;
          lVar12 = 0;
          local_118._16_8_ = local_118._8_8_;
          do {
            local_58._0_8_ = *(undefined8 *)(local_168 + lVar12);
            local_58.second = *(double *)(local_168 + lVar12 + 8);
            robin_hood::detail::
            Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
            emplace<robin_hood::pair<char,double>>
                      (&local_48,
                       (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>
                        *)local_118,&local_58);
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x40);
          this_00 = robin_hood::detail::
                    Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                    ::
                    operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                              ((Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                                *)__return_storage_ptr__,key);
LAB_0012877d:
          robin_hood::detail::
          Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
          operator=(this_00,(Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                             *)local_118);
          pDVar11 = local_128;
          freq_dict = local_120;
          if (local_118._32_8_ == 0) goto LAB_001287c8;
          local_118._24_8_ = 0;
          puVar4 = local_118;
          __ptr = (Node *)local_118._8_8_;
        }
        freq_dict = local_120;
        pDVar11 = local_128;
        if (__ptr != (Node *)(puVar4 + 0x20)) {
          free(__ptr);
          pDVar11 = local_128;
        }
      }
LAB_001287c8:
      psVar13 = &key[1]._M_string_length;
      uVar10 = *(ulong *)(puVar14 + 1);
      if (uVar10 == 0) {
        puVar5 = (ulong *)(puVar14 + 9);
        do {
          puVar15 = puVar5;
          psVar13 = psVar13 + 0x28;
          uVar10 = *puVar15;
          puVar5 = puVar15 + 1;
        } while (uVar10 == 0);
      }
      else {
        puVar15 = (ulong *)(puVar14 + 1);
      }
      uVar3 = 0;
      for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
        uVar3 = uVar3 + 1;
      }
      iVar17.mInfo = (uint8_t *)((long)puVar15 + (ulong)(uVar3 >> 3));
      iVar17.mKeyVals = (NodePtr)(psVar13 + (ulong)(uVar3 >> 3) * 5);
    } while ((NodePtr)(psVar13 + (ulong)(uVar3 >> 3) * 5) != pDVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

robin_hood::unordered_map<string, char2double> ProbMap::createTransitionDict(string2int32 &freq_dict) {
    robin_hood::unordered_map<string, char2double> fd_map = calcFirstBase(freq_dict);
    for (const auto &ele: freq_dict) {
        if ((int)ele.first.length() < codewordLen) {
            int32_t A = checkFd(ele.first, 'A', freq_dict);
            int32_t T = checkFd(ele.first, 'T', freq_dict);
            int32_t G = checkFd(ele.first, 'G', freq_dict);
            int32_t C = checkFd(ele.first, 'C', freq_dict);
            if (normalized) {
                double csum = ele.second;//A + T + G + C;
                if (static_cast<bool>(csum)) {
                    fd_map[ele.first] = {{'A', 1.0 * A / csum},
                                         {'T', 1.0 * T / csum},
                                         {'C', 1.0 * C / csum},
                                         {'G', 1.0 * G / csum}};
                } else {
                    fd_map[ele.first] = {{'A', 0.0},
                                         {'T', 0.0},
                                         {'C', 0.0},
                                         {'G', 0.0}};
                }
            } else {
                fd_map[ele.first] = {{'A', A},
                                     {'T', T},
                                     {'C', C},
                                     {'G', G}};
            }
        }
    }
    return fd_map;
}